

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O2

ControlBlock * __thiscall
density::detail::
SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>
::page_overflow(SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>
                *this,LfQueue_ProgressGuarantee i_progress_guarantee,ControlBlock *i_tail)

{
  ControlBlock *pCVar1;
  
  pCVar1 = (ControlBlock *)(((ulong)i_tail & 0xffffffffffffff00) + 0xc0);
  if (i_tail < pCVar1) {
    raw_atomic_store(&i_tail->m_next,(ulong)i_tail & 0xffffffffffffff00 | 0xc2,memory_order_seq_cst)
    ;
    return pCVar1;
  }
  pCVar1 = get_or_allocate_next_page(this,i_progress_guarantee,i_tail);
  return pCVar1;
}

Assistant:

DENSITY_NO_INLINE ControlBlock * page_overflow(
              LfQueue_ProgressGuarantee i_progress_guarantee, ControlBlock * const i_tail)
            {
                auto const page_end = get_end_control_block(i_tail);
                if (i_tail < page_end)
                {
                    /* There is space between the (presumed) current tail and the end control block.
                        We try to pad it with a dead element. */

                    DENSITY_ASSUME(m_tail == i_tail);

                    auto const block = static_cast<ControlBlock *>(i_tail);
                    raw_atomic_store(
                      &block->m_next,
                      reinterpret_cast<uintptr_t>(page_end) + LfQueue_Dead,
                      mem_release);
                    return page_end;
                }
                else
                {
                    // get or allocate a new page
                    DENSITY_ASSUME(i_tail == page_end);
                    return get_or_allocate_next_page(i_progress_guarantee, i_tail);
                }
            }